

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phase.cc
# Opt level: O1

int main(int argc,char **argv)

{
  string *__s;
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined7 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  size_t sVar6;
  long lVar8;
  char *pcVar9;
  long lVar10;
  initializer_list<double> __l;
  int fft_length;
  int num_denominator_order;
  int num_numerator_order;
  vector<double,_std::allocator<double>_> waveform;
  vector<double,_std::allocator<double>_> numerator_coefficients;
  vector<double,_std::allocator<double>_> denominator_coefficients;
  ifstream ifs_for_denominator;
  vector<double,_std::allocator<double>_> output;
  FilterCoefficientsToPhaseSpectrum filter_coefficients_to_phase_spectrum;
  ostringstream error_message;
  ostringstream error_message_7;
  Buffer buffer;
  int local_788;
  int local_784;
  string *local_780;
  int local_778;
  int local_774;
  string *local_770;
  ulong local_768;
  string local_760;
  undefined8 local_740;
  char *local_738;
  string *local_730;
  vector<double,_std::allocator<double>_> local_728;
  vector<double,_std::allocator<double>_> local_710;
  string local_6f8;
  byte abStack_6d8 [80];
  ios_base local_688 [408];
  vector<double,_std::allocator<double>_> local_4f0;
  undefined1 local_4d8 [24];
  RealValuedFastFourierTransform local_4c0;
  bool local_458;
  string local_450;
  byte abStack_430 [80];
  ios_base local_3e0 [408];
  undefined1 local_248 [376];
  undefined1 local_d0 [128];
  bool local_50;
  
  local_784 = 0x100;
  local_774 = 0;
  local_740 = 0;
  local_778 = 0;
  local_768 = 0;
  local_780 = (string *)0x0;
  local_738 = (char *)0x0;
  local_770 = (string *)0x0;
  local_788 = 0;
  do {
    iVar4 = ya_getopt_long(argc,argv,"l:m:n:z:p:uh",(option *)0x0,(int *)0x0);
    if (0xe < iVar4 - 0x6cU) {
      if (iVar4 == -1) {
        iVar4 = 2;
      }
      else {
        if (iVar4 != 0x68) goto switchD_001037ed_caseD_6f;
        anon_unknown.dwarf_2f28::PrintUsage((ostream *)&std::cout);
        local_788 = 0;
        iVar4 = 1;
      }
      goto LAB_00103ae4;
    }
    uVar7 = (undefined7)((ulong)ya_optarg >> 8);
    switch(iVar4) {
    case 0x6c:
      std::__cxx11::string::string((string *)&local_450,ya_optarg,(allocator *)&local_6f8);
      bVar1 = sptk::ConvertStringToInteger(&local_450,&local_784);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p);
      }
      if (bVar1) goto LAB_001039d6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,"The argument for the -l option must be an integer",0x31);
      local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
      sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_450,ya_optarg,(allocator *)&local_6f8);
      bVar1 = sptk::ConvertStringToInteger(&local_450,&local_774);
      bVar3 = -1 < local_774;
      paVar5 = &local_450.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != paVar5) {
        operator_delete(local_450._M_dataplus._M_p);
        paVar5 = extraout_RAX;
      }
      if (bVar1 && bVar3) {
        local_780 = (string *)CONCAT71((int7)((ulong)paVar5 >> 8),1);
LAB_001039b2:
        iVar4 = 0;
        goto LAB_00103ae4;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,
                 "The argument for the -m option must be a non-negative integer",0x3d);
      local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
      sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
      break;
    case 0x6e:
      std::__cxx11::string::string((string *)&local_450,ya_optarg,(allocator *)&local_6f8);
      bVar1 = sptk::ConvertStringToInteger(&local_450,&local_778);
      bVar3 = -1 < local_778;
      paVar5 = &local_450.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != paVar5) {
        operator_delete(local_450._M_dataplus._M_p);
        paVar5 = extraout_RAX_00;
      }
      if (bVar1 && bVar3) {
        local_768 = CONCAT71((int7)((ulong)paVar5 >> 8),1);
        goto LAB_001039b2;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,
                 "The argument for the -n option must be a non-negative integer",0x3d);
      local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
      sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
      break;
    default:
switchD_001037ed_caseD_6f:
      anon_unknown.dwarf_2f28::PrintUsage((ostream *)&std::cerr);
      goto LAB_00103ad7;
    case 0x70:
      local_738 = ya_optarg;
      local_768 = CONCAT71(uVar7,1);
      goto LAB_001039d6;
    case 0x75:
      local_740 = CONCAT71((int7)((ulong)((long)&switchD_001037ed::switchdataD_0010d004 +
                                         (long)(int)(&switchD_001037ed::switchdataD_0010d004)
                                                    [iVar4 - 0x6cU]) >> 8),1);
      goto LAB_001039d6;
    case 0x7a:
      local_770 = (string *)ya_optarg;
      local_780 = (string *)CONCAT71(uVar7,1);
LAB_001039d6:
      iVar4 = 0;
      goto LAB_00103ae4;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
      operator_delete(local_6f8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_450);
    std::ios_base::~ios_base(local_3e0);
LAB_00103ad7:
    iVar4 = 1;
    local_788 = 1;
LAB_00103ae4:
  } while (iVar4 == 0);
  if (iVar4 != 2) {
    return local_788;
  }
  bVar1 = sptk::SetBinaryMode();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_450,"Cannot set translation mode",0x1b);
    local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
    sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
      operator_delete(local_6f8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_450);
    std::ios_base::~ios_base(local_3e0);
    return 1;
  }
  if ((((ulong)local_780 & 1) == 0) && ((local_768 & 1) == 0)) {
    if (argc - ya_optind < 2) {
      if (argc == ya_optind) {
        pcVar9 = (char *)0x0;
      }
      else {
        pcVar9 = argv[ya_optind];
      }
      local_780 = &local_450;
      std::ifstream::ifstream(local_780);
      if ((pcVar9 == (char *)0x0) ||
         (std::ifstream::open((char *)&local_450,(_Ios_Openmode)pcVar9),
         (abStack_430[*(long *)(local_450._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          local_780 = (string *)&std::cin;
        }
        sptk::FilterCoefficientsToPhaseSpectrum::FilterCoefficientsToPhaseSpectrum
                  ((FilterCoefficientsToPhaseSpectrum *)local_d0,local_784 + -1,0,local_784,
                   (bool)((byte)local_740 & 1));
        local_248._0_8_ = &PTR__Buffer_00112c08;
        local_248._8_8_ = &PTR__Buffer_00112c38;
        memset(local_248 + 0x10,0,0x90);
        iVar4 = local_784;
        if (local_50 == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_6f8,"Failed to initialize FilterCoefficientsToPhaseSpectrum",
                     0x36);
          local_4d8._0_8_ = local_4d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"phase","");
          sptk::PrintErrorMessage((string *)local_4d8,(ostringstream *)&local_6f8);
          if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
            operator_delete((void *)local_4d8._0_8_);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6f8);
          std::ios_base::~ios_base(local_688);
          local_788 = 1;
          bVar1 = false;
        }
        else {
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&local_760,(long)local_784,
                     (allocator_type *)&local_6f8);
          iVar4 = iVar4 / 2 + 1;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_728,(long)iVar4,(allocator_type *)&local_6f8);
          do {
            bVar1 = sptk::ReadStream<double>
                              (true,0,0,local_784,
                               (vector<double,_std::allocator<double>_> *)&local_760,
                               (istream *)local_780,(int *)0x0);
            if (!bVar1) goto LAB_00104832;
            local_4d8._0_8_ = (_func_int **)0x3ff0000000000000;
            __l._M_len = 1;
            __l._M_array = (iterator)local_4d8;
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)&local_6f8,__l,
                       (allocator_type *)&local_710);
            bVar3 = sptk::FilterCoefficientsToPhaseSpectrum::Run
                              ((FilterCoefficientsToPhaseSpectrum *)local_d0,
                               (vector<double,_std::allocator<double>_> *)&local_760,
                               (vector<double,_std::allocator<double>_> *)&local_6f8,&local_728,
                               (Buffer *)local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6f8._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_6f8._M_dataplus._M_p);
            }
            if (!bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6f8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_6f8,"Failed to transform waveform to phase",0x25);
              local_4d8._0_8_ = local_4d8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"phase","");
              sptk::PrintErrorMessage((string *)local_4d8,(ostringstream *)&local_6f8);
              goto LAB_001047f7;
            }
            bVar3 = sptk::WriteStream<double>(0,iVar4,&local_728,(ostream *)&std::cout,(int *)0x0);
          } while (bVar3);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_6f8,"Failed to write phase",0x15);
          local_4d8._0_8_ = local_4d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"phase","");
          sptk::PrintErrorMessage((string *)local_4d8,(ostringstream *)&local_6f8);
LAB_001047f7:
          if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
            operator_delete((void *)local_4d8._0_8_);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6f8);
          std::ios_base::~ios_base(local_688);
          local_788 = 1;
LAB_00104832:
          if (local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_760._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_760._M_dataplus._M_p);
          }
          bVar1 = !bVar1;
        }
        sptk::FilterCoefficientsToPhaseSpectrum::Buffer::~Buffer((Buffer *)local_248);
        local_d0._0_8_ = &PTR__FilterCoefficientsToPhaseSpectrum_00112c68;
        sptk::RealValuedFastFourierTransform::~RealValuedFastFourierTransform
                  ((RealValuedFastFourierTransform *)(local_d0 + 0x18));
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_6f8,"Cannot open file ",0x11);
        sVar6 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_6f8,pcVar9,sVar6);
        local_248._0_8_ = local_248 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"phase","");
        sptk::PrintErrorMessage((string *)local_248,(ostringstream *)&local_6f8);
        if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
          operator_delete((void *)local_248._0_8_);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6f8);
        std::ios_base::~ios_base(local_688);
        local_788 = 1;
        bVar1 = false;
      }
      std::ifstream::~ifstream(&local_450);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,"Too many input files",0x14);
      local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
      sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
        operator_delete(local_6f8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_450);
      std::ios_base::~ios_base(local_3e0);
      local_788 = 1;
      bVar1 = false;
    }
    goto joined_r0x00104775;
  }
  lVar8 = (long)local_774;
  lVar10 = (long)local_778;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_728,lVar8 + 1U,(allocator_type *)&local_450);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_710,lVar10 + 1U,(allocator_type *)&local_450);
  if ((((ulong)local_780 & 1) == 0) ||
     (((local_768 & 1) == 0 || (local_738 != (char *)0x0 && local_770 != (string *)0x0)))) {
    if (ya_optind < argc) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,"Too many input files",0x14);
      local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
      sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
      goto LAB_00103d01;
    }
    local_730 = &local_450;
    std::ifstream::ifstream(local_730);
    pcVar9 = local_738;
    __s = local_770;
    if ((local_770 != (string *)0x0 & (byte)local_780) == 1) {
      std::ifstream::open((char *)&local_450,(_Ios_Openmode)local_770);
      if ((abStack_430[*(long *)(local_450._M_dataplus._M_p + -0x18)] & 5) == 0) goto LAB_00103f39;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_6f8,"Cannot open file ",0x11);
      sVar6 = strlen((char *)__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_6f8,(char *)__s,sVar6);
      local_248._0_8_ = local_248 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"phase","");
      sptk::PrintErrorMessage((string *)local_248,(ostringstream *)&local_6f8);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6f8);
      std::ios_base::~ios_base(local_688);
      local_788 = 1;
      bVar1 = false;
    }
    else {
      *local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start = 1.0;
LAB_00103f39:
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        local_730 = (string *)&std::cin;
      }
      local_770 = &local_6f8;
      std::ifstream::ifstream(local_770);
      if ((pcVar9 != (char *)0x0 & (byte)local_768) == 1) {
        std::ifstream::open((char *)&local_6f8,(_Ios_Openmode)pcVar9);
        if ((abStack_6d8[*(long *)(local_6f8._M_dataplus._M_p + -0x18)] & 5) == 0)
        goto LAB_0010408d;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_248,"Cannot open file ",0x11);
        sVar6 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_248,pcVar9,sVar6);
        local_d0._0_8_ = local_d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"phase","");
        sptk::PrintErrorMessage((string *)local_d0,(ostringstream *)local_248);
        if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
          operator_delete((void *)local_d0._0_8_);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
        std::ios_base::~ios_base((ios_base *)(local_248 + 0x70));
        local_788 = 1;
        bVar1 = false;
      }
      else {
        *local_710.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start = 1.0;
LAB_0010408d:
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          local_770 = (string *)&std::cin;
        }
        sptk::FilterCoefficientsToPhaseSpectrum::FilterCoefficientsToPhaseSpectrum
                  ((FilterCoefficientsToPhaseSpectrum *)local_4d8,local_774,local_778,local_784,
                   (bool)((byte)local_740 & 1));
        local_d0._0_8_ = &PTR__Buffer_00112c08;
        local_d0._8_8_ = &PTR__Buffer_00112c38;
        memset(local_d0 + 0x10,0,0x90);
        if (local_458 == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_248,"Failed to initialize FilterCoefficientsToPhaseSpectrum",
                     0x36);
          local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"phase","");
          sptk::PrintErrorMessage(&local_760,(ostringstream *)local_248);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_760._M_dataplus._M_p != &local_760.field_2) {
            operator_delete(local_760._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
          std::ios_base::~ios_base((ios_base *)(local_248 + 0x70));
          local_788 = 1;
          bVar1 = false;
        }
        else {
          iVar4 = local_784 / 2 + 1;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_4f0,(long)iVar4,(allocator_type *)local_248);
          do {
            if (((((ulong)local_780 & 1) != 0) &&
                (bVar1 = sptk::ReadStream<double>
                                   (false,0,0,(int)(lVar8 + 1U),&local_728,(istream *)local_730,
                                    (int *)0x0), !bVar1)) ||
               (((local_768 & 1) != 0 &&
                (bVar1 = sptk::ReadStream<double>
                                   (false,0,0,(int)(lVar10 + 1U),&local_710,(istream *)local_770,
                                    (int *)0x0), !bVar1)))) {
              bVar1 = true;
              goto LAB_00104701;
            }
            bVar1 = sptk::FilterCoefficientsToPhaseSpectrum::Run
                              ((FilterCoefficientsToPhaseSpectrum *)local_4d8,&local_728,&local_710,
                               &local_4f0,(Buffer *)local_d0);
            if (!bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_248,"Failed to transform filter coefficients to phase",
                         0x30);
              local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"phase","");
              sptk::PrintErrorMessage(&local_760,(ostringstream *)local_248);
              goto LAB_001046c7;
            }
            bVar1 = sptk::WriteStream<double>(0,iVar4,&local_4f0,(ostream *)&std::cout,(int *)0x0);
          } while (bVar1);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_248,"Failed to write phase",0x15);
          local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"phase","");
          sptk::PrintErrorMessage(&local_760,(ostringstream *)local_248);
LAB_001046c7:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_760._M_dataplus._M_p != &local_760.field_2) {
            operator_delete(local_760._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
          std::ios_base::~ios_base((ios_base *)(local_248 + 0x70));
          local_788 = 1;
          bVar1 = false;
LAB_00104701:
          if (local_4f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_4f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        sptk::FilterCoefficientsToPhaseSpectrum::Buffer::~Buffer((Buffer *)local_d0);
        local_4d8._0_8_ = &PTR__FilterCoefficientsToPhaseSpectrum_00112c68;
        sptk::RealValuedFastFourierTransform::~RealValuedFastFourierTransform(&local_4c0);
      }
      std::ifstream::~ifstream(&local_6f8);
    }
    std::ifstream::~ifstream(&local_450);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_450,"Numerator and denominator coefficient files are required",0x38
              );
    local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
    sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
LAB_00103d01:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
      operator_delete(local_6f8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_450);
    std::ios_base::~ios_base(local_3e0);
    local_788 = 1;
    bVar1 = false;
  }
  if (local_710.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_710.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
joined_r0x00104775:
  if (bVar1) {
    local_788 = 0;
  }
  return local_788;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int num_numerator_order(kDefaultNumNumeratorOrder);
  int num_denominator_order(kDefaultNumDenominatorOrder);
  const char* numerator_coefficients_file(NULL);
  const char* denominator_coefficients_file(NULL);
  bool is_numerator_specified(false);
  bool is_denominator_specified(false);
  bool unwrapping(kDefaultUnwrappingFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:n:z:p:uh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("phase", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_numerator_order) ||
            num_numerator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("phase", error_message);
          return 1;
        }
        is_numerator_specified = true;
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_denominator_order) ||
            num_denominator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -n option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("phase", error_message);
          return 1;
        }
        is_denominator_specified = true;
        break;
      }
      case 'z': {
        numerator_coefficients_file = optarg;
        is_numerator_specified = true;
        break;
      }
      case 'p': {
        denominator_coefficients_file = optarg;
        is_denominator_specified = true;
        break;
      }
      case 'u': {
        unwrapping = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("phase", error_message);
    return 1;
  }

  if (is_numerator_specified || is_denominator_specified) {
    const int numerator_length(num_numerator_order + 1);
    const int denominator_length(num_denominator_order + 1);
    std::vector<double> numerator_coefficients(numerator_length);
    std::vector<double> denominator_coefficients(denominator_length);

    if (is_numerator_specified && is_denominator_specified &&
        (NULL == numerator_coefficients_file ||
         NULL == denominator_coefficients_file)) {
      std::ostringstream error_message;
      error_message
          << "Numerator and denominator coefficient files are required";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    const int num_input_files(argc - optind);
    if (0 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    std::ifstream ifs_for_numerator;
    if (is_numerator_specified && NULL != numerator_coefficients_file) {
      ifs_for_numerator.open(numerator_coefficients_file,
                             std::ios::in | std::ios::binary);
      if (ifs_for_numerator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << numerator_coefficients_file;
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    } else {
      numerator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_numerator(
        ifs_for_numerator.is_open() ? ifs_for_numerator : std::cin);

    std::ifstream ifs_for_denominator;
    if (is_denominator_specified && NULL != denominator_coefficients_file) {
      ifs_for_denominator.open(denominator_coefficients_file,
                               std::ios::in | std::ios::binary);
      if (ifs_for_denominator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << denominator_coefficients_file;
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    } else {
      denominator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_denominator(
        ifs_for_denominator.is_open() ? ifs_for_denominator : std::cin);

    sptk::FilterCoefficientsToPhaseSpectrum
        filter_coefficients_to_phase_spectrum(
            num_numerator_order, num_denominator_order, fft_length, unwrapping);
    sptk::FilterCoefficientsToPhaseSpectrum::Buffer buffer;
    if (!filter_coefficients_to_phase_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize FilterCoefficientsToPhaseSpectrum";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> output(output_length);
    while ((!is_numerator_specified ||
            sptk::ReadStream(false, 0, 0, numerator_length,
                             &numerator_coefficients,
                             &input_stream_for_numerator, NULL)) &&
           (!is_denominator_specified ||
            sptk::ReadStream(false, 0, 0, denominator_length,
                             &denominator_coefficients,
                             &input_stream_for_denominator, NULL))) {
      if (!filter_coefficients_to_phase_spectrum.Run(numerator_coefficients,
                                                     denominator_coefficients,
                                                     &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform filter coefficients to phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    }
  } else {
    const int num_input_files(argc - optind);
    if (1 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }
    const char* input_file(0 == num_input_files ? NULL : argv[optind]);

    std::ifstream ifs;
    if (NULL != input_file) {
      ifs.open(input_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << input_file;
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    sptk::FilterCoefficientsToPhaseSpectrum waveform_to_phase_spectrum(
        fft_length - 1, 0, fft_length, unwrapping);
    sptk::FilterCoefficientsToPhaseSpectrum::Buffer buffer;
    if (!waveform_to_phase_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize FilterCoefficientsToPhaseSpectrum";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> waveform(fft_length);
    std::vector<double> output(output_length);
    while (sptk::ReadStream(true, 0, 0, fft_length, &waveform, &input_stream,
                            NULL)) {
      if (!waveform_to_phase_spectrum.Run(waveform, {1}, &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    }
  }

  return 0;
}